

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDef.cpp
# Opt level: O1

ostream * operator<<(ostream *os,AmsNetId *netId)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_18;
  
  *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 2;
  uStack_18 = in_RAX;
  poVar1 = (ostream *)std::ostream::operator<<(os,(uint)netId->b[0]);
  uStack_18._0_4_ = CONCAT13(0x2e,(undefined3)uStack_18);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_18 + 3),1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)netId->b[1]);
  uStack_18._0_5_ = CONCAT14(0x2e,(undefined4)uStack_18);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_18 + 4),1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)netId->b[2]);
  uStack_18._0_6_ = CONCAT15(0x2e,(undefined5)uStack_18);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_18 + 5),1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)netId->b[3]);
  uStack_18._0_7_ = CONCAT16(0x2e,(undefined6)uStack_18);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_18 + 6),1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)netId->b[4]);
  uStack_18 = CONCAT17(0x2e,(undefined7)uStack_18);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_18 + 7),1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)netId->b[5]);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const AmsNetId& netId)
{
    return os << std::dec << (int)netId.b[0] << '.' << (int)netId.b[1] << '.' << (int)netId.b[2] << '.' <<
           (int)netId.b[3] << '.' << (int)netId.b[4] << '.' << (int)netId.b[5];
}